

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::Clara::Help::Help(Help *this,bool *showHelpFlag)

{
  StringRef optName;
  StringRef optName_00;
  StringRef optName_01;
  Opt *pOVar1;
  Opt *rawChars;
  ParserRefImpl<Catch::Clara::Opt> *in_RDI;
  Opt *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  StringRef *in_stack_ffffffffffffff80;
  Opt *in_stack_ffffffffffffff90;
  StringRef local_28;
  
  Opt::Opt<Catch::Clara::Help::Help(bool&)::__0>
            (in_stack_ffffffffffffff90,(anon_class_8_1_beab0a68_for_m_lambda *)in_RDI);
  (in_RDI->super_ComposableParserImpl<Catch::Clara::Opt>).super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__Help_002a9120;
  StringRef::StringRef(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  Detail::ParserRefImpl<Catch::Clara::Opt>::operator()(in_RDI,local_28);
  StringRef::StringRef(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  optName.m_size = (size_type)in_stack_ffffffffffffff80;
  optName.m_start = in_stack_ffffffffffffff78;
  pOVar1 = Opt::operator[](in_stack_ffffffffffffff70,optName);
  StringRef::StringRef((StringRef *)pOVar1,in_stack_ffffffffffffff78);
  optName_00.m_size = (size_type)pOVar1;
  optName_00.m_start = in_stack_ffffffffffffff78;
  rawChars = Opt::operator[](in_stack_ffffffffffffff70,optName_00);
  StringRef::StringRef((StringRef *)pOVar1,(char *)rawChars);
  optName_01.m_size = (size_type)pOVar1;
  optName_01.m_start = (char *)rawChars;
  pOVar1 = Opt::operator[](in_stack_ffffffffffffff70,optName_01);
  Detail::ParserRefImpl<Catch::Clara::Opt>::optional
            (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>);
  return;
}

Assistant:

Help::Help( bool& showHelpFlag ):
            Opt( [&]( bool flag ) {
                showHelpFlag = flag;
                return ParserResult::ok( ParseResultType::ShortCircuitAll );
            } ) {
            static_cast<Opt&> ( *this )(
                "display usage information" )["-?"]["-h"]["--help"]
                .optional();
        }